

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

char * duckdb_snappy::internal::CompressFragment
                 (char *input,size_t input_size,char *op,uint16_t *table,int table_size)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  short sVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  size_t len;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  size_t offset;
  uint uVar14;
  ulong *puVar15;
  char cVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  ulong *local_78;
  
  puVar2 = (ulong *)(input + input_size);
  puVar15 = (ulong *)input;
  if (input_size < 0xf) {
LAB_003235a3:
    if (puVar2 <= puVar15) {
      return op;
    }
    pcVar21 = EmitLiteral<false>(op,(char *)puVar15,(int)puVar2 - (int)puVar15);
    return pcVar21;
  }
  uVar13 = table_size * 2 - 2;
  puVar1 = (ulong *)((long)puVar2 - 0xf);
  iVar11 = *(int *)(input + 1);
LAB_003232cb:
  local_78 = (ulong *)((long)puVar15 + 1);
  uVar12 = *(ulong *)((long)puVar15 + 1);
  if ((long)puVar1 - (long)local_78 < 0x10) {
    uVar7 = 0x20;
  }
  else {
    uVar14 = (1 - (int)input) + (int)puVar15 & 0xffff;
    lVar18 = 0;
    lVar9 = -1;
    lVar6 = -2;
    cVar16 = '\0';
    for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
      cVar8 = cVar16;
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        iVar5 = (int)uVar12;
        if (lVar18 == lVar20) {
          iVar5 = iVar11;
        }
        uVar7 = (ulong)((uint)(iVar5 * 0x1e35a7bd) >> 0x10 & uVar13);
        uVar17 = (ulong)*(ushort *)(uVar7 + (long)table);
        *(short *)(uVar7 + (long)table) = (short)uVar14 + (short)lVar20;
        if (*(int *)(input + uVar17) == iVar5) {
          *op = cVar8;
          uVar7 = puVar15[1];
          *(ulong *)(op + 1) = *puVar15;
          *(ulong *)(op + 9) = uVar7;
          local_78 = (ulong *)((long)puVar15 + (lVar20 - lVar9));
          op = op + (lVar20 - lVar6);
          goto LAB_0032341d;
        }
        uVar12 = uVar12 >> 8;
        cVar8 = cVar8 + '\x04';
      }
      uVar12 = *(ulong *)((long)puVar15 + lVar19 * 4 + 5);
      cVar16 = cVar16 + '\x10';
      lVar6 = lVar6 + -4;
      lVar9 = lVar9 + -4;
      uVar14 = uVar14 + 4;
      lVar18 = lVar18 + -4;
    }
    uVar7 = 0x30;
    local_78 = (ulong *)((long)puVar15 + 0x11);
  }
  while( true ) {
    puVar3 = (ulong *)((uVar7 >> 5) + (long)local_78);
    if (puVar1 < puVar3) goto LAB_003235a3;
    uVar10 = (ulong)((uint)((int)uVar12 * 0x1e35a7bd) >> 0x10 & uVar13);
    uVar17 = (ulong)*(ushort *)(uVar10 + (long)table);
    *(short *)(uVar10 + (long)table) = (short)local_78 - (short)input;
    if (*(int *)(input + uVar17) == (int)uVar12) break;
    uVar12 = (ulong)(uint)*puVar3;
    uVar7 = (ulong)(uint)((int)(uVar7 >> 5) + (int)uVar7);
    local_78 = puVar3;
  }
  op = EmitLiteral<true>(op,(char *)puVar15,(int)local_78 - (int)puVar15);
LAB_0032341d:
  pcVar21 = input + uVar17;
  puVar15 = (ulong *)((long)local_78 + 4);
  if (puVar2 + -2 < puVar15) {
    lVar9 = 0;
LAB_003234d4:
    len = lVar9 + 4;
LAB_003234e1:
    if (puVar15 <= puVar2 + -2) {
      uVar7 = *puVar15;
      if (*(ulong *)(pcVar21 + len) == uVar7) goto code_r0x003234f3;
      uVar12 = *(ulong *)(pcVar21 + len) ^ uVar7;
      uVar17 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      if ((int)uVar12 == 0) {
        uVar7 = *(ulong *)((long)puVar15 + 4);
      }
      uVar12 = uVar7 >> ((byte)uVar17 & 0x18);
      len = len + (uVar17 >> 3 & 0x1fffffff);
      offset = (long)local_78 - (long)pcVar21;
      local_78 = (ulong *)(len + (long)local_78);
      goto LAB_0032352d;
    }
    goto LAB_00323540;
  }
  uVar7 = *puVar15;
  if (*(ulong *)(pcVar21 + 4) == uVar7) {
    puVar15 = (ulong *)((long)local_78 + 0xc);
    lVar9 = 8;
    goto LAB_003234d4;
  }
  uVar17 = *(ulong *)(pcVar21 + 4) ^ uVar7;
  uVar12 = 0;
  if (uVar17 != 0) {
    for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
    }
  }
  uVar10 = uVar12 >> 3 & 0x1fffffff;
  if ((int)uVar17 == 0) {
    uVar7 = local_78[1];
  }
  uVar12 = uVar7 >> ((byte)uVar12 & 0x18);
  len = uVar10 + 4;
  offset = (long)local_78 - (long)pcVar21;
  local_78 = (ulong *)((long)local_78 + uVar10 + 4);
  goto LAB_0032346d;
code_r0x003234f3:
  puVar15 = puVar15 + 1;
  len = len + 8;
  goto LAB_003234e1;
LAB_00323540:
  if (puVar2 <= puVar15) goto LAB_00323575;
  if (pcVar21[len] != (char)*puVar15) {
    if (puVar15 <= puVar2 + -1) {
      uVar12 = *puVar15;
    }
    puVar15 = (ulong *)((long)local_78 + len);
    offset = (long)local_78 - (long)pcVar21;
    local_78 = puVar15;
    if (7 < len - 4) goto LAB_0032352d;
    goto LAB_0032346d;
  }
  puVar15 = (ulong *)((long)puVar15 + 1);
  len = len + 1;
  goto LAB_00323540;
LAB_00323575:
  puVar15 = (ulong *)((long)local_78 + len);
  offset = (long)local_78 - (long)pcVar21;
  local_78 = puVar15;
  if (len - 4 < 8) {
LAB_0032346d:
    op = EmitCopyAtMost64<true>(op,offset,len);
  }
  else {
LAB_0032352d:
    op = EmitCopy<false>(op,offset,len);
  }
  puVar15 = local_78;
  if (puVar1 <= local_78) goto LAB_003235a3;
  sVar4 = (short)local_78 - (short)input;
  *(short *)((ulong)((uint)(*(int *)((long)local_78 + -1) * 0x1e35a7bd) >> 0x10 & uVar13) +
            (long)table) = sVar4 + -1;
  uVar7 = (ulong)((uint)((int)uVar12 * 0x1e35a7bd) >> 0x10 & uVar13);
  uVar17 = (ulong)*(ushort *)(uVar7 + (long)table);
  *(short *)(uVar7 + (long)table) = sVar4;
  if (*(int *)(input + uVar17) != (int)uVar12) goto LAB_00323590;
  goto LAB_0032341d;
LAB_00323590:
  iVar11 = (int)(uVar12 >> 8);
  goto LAB_003232cb;
}

Assistant:

char* CompressFragment(const char* input, size_t input_size, char* op,
                       uint16_t* table, const int table_size) {
  // "ip" is the input pointer, and "op" is the output pointer.
  const char* ip = input;
  assert(input_size <= kBlockSize);
  assert((table_size & (table_size - 1)) == 0);  // table must be power of two
  const uint32_t mask = 2 * (table_size - 1);
  const char* ip_end = input + input_size;
  const char* base_ip = ip;

  const size_t kInputMarginBytes = 15;
  if (SNAPPY_PREDICT_TRUE(input_size >= kInputMarginBytes)) {
    const char* ip_limit = input + input_size - kInputMarginBytes;

    for (uint32_t preload = LittleEndian::Load32(ip + 1);;) {
      // Bytes in [next_emit, ip) will be emitted as literal bytes.  Or
      // [next_emit, ip_end) after the main loop.
      const char* next_emit = ip++;
      uint64_t data = LittleEndian::Load64(ip);
      // The body of this loop calls EmitLiteral once and then EmitCopy one or
      // more times.  (The exception is that when we're close to exhausting
      // the input we goto emit_remainder.)
      //
      // In the first iteration of this loop we're just starting, so
      // there's nothing to copy, so calling EmitLiteral once is
      // necessary.  And we only start a new iteration when the
      // current iteration has determined that a call to EmitLiteral will
      // precede the next call to EmitCopy (if any).
      //
      // Step 1: Scan forward in the input looking for a 4-byte-long match.
      // If we get close to exhausting the input then goto emit_remainder.
      //
      // Heuristic match skipping: If 32 bytes are scanned with no matches
      // found, start looking only at every other byte. If 32 more bytes are
      // scanned (or skipped), look at every third byte, etc.. When a match is
      // found, immediately go back to looking at every byte. This is a small
      // loss (~5% performance, ~0.1% density) for compressible data due to more
      // bookkeeping, but for non-compressible data (such as JPEG) it's a huge
      // win since the compressor quickly "realizes" the data is incompressible
      // and doesn't bother looking for matches everywhere.
      //
      // The "skip" variable keeps track of how many bytes there are since the
      // last match; dividing it by 32 (ie. right-shifting by five) gives the
      // number of bytes to move ahead for each iteration.
      uint32_t skip = 32;

      const char* candidate;
      if (ip_limit - ip >= 16) {
        auto delta = ip - base_ip;
        for (int j = 0; j < 4; ++j) {
          for (int k = 0; k < 4; ++k) {
            int i = 4 * j + k;
            // These for-loops are meant to be unrolled. So we can freely
            // special case the first iteration to use the value already
            // loaded in preload.
            uint32_t dword = i == 0 ? preload : static_cast<uint32_t>(data);
            assert(dword == LittleEndian::Load32(ip + i));
            uint16_t* table_entry = TableEntry(table, dword, mask);
            candidate = base_ip + *table_entry;
            assert(candidate >= base_ip);
            assert(candidate < ip + i);
            *table_entry = delta + i;
            if (SNAPPY_PREDICT_FALSE(LittleEndian::Load32(candidate) == dword)) {
              *op = LITERAL | (i << 2);
              UnalignedCopy128(next_emit, op + 1);
              ip += i;
              op = op + i + 2;
              goto emit_match;
            }
            data >>= 8;
          }
          data = LittleEndian::Load64(ip + 4 * j + 4);
        }
        ip += 16;
        skip += 16;
      }
      while (true) {
        assert(static_cast<uint32_t>(data) == LittleEndian::Load32(ip));
        uint16_t* table_entry = TableEntry(table, data, mask);
        uint32_t bytes_between_hash_lookups = skip >> 5;
        skip += bytes_between_hash_lookups;
        const char* next_ip = ip + bytes_between_hash_lookups;
        if (SNAPPY_PREDICT_FALSE(next_ip > ip_limit)) {
          ip = next_emit;
          goto emit_remainder;
        }
        candidate = base_ip + *table_entry;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          break;
        }
        data = LittleEndian::Load32(next_ip);
        ip = next_ip;
      }

      // Step 2: A 4-byte match has been found.  We'll later see if more
      // than 4 bytes match.  But, prior to the match, input
      // bytes [next_emit, ip) are unmatched.  Emit them as "literal bytes."
      assert(next_emit + 16 <= ip_end);
      op = EmitLiteral</*allow_fast_path=*/true>(op, next_emit, ip - next_emit);

      // Step 3: Call EmitCopy, and then see if another EmitCopy could
      // be our next move.  Repeat until we find no match for the
      // input immediately after what was consumed by the last EmitCopy call.
      //
      // If we exit this loop normally then we need to call EmitLiteral next,
      // though we don't yet know how big the literal will be.  We handle that
      // by proceeding to the next iteration of the main loop.  We also can exit
      // this loop via goto if we get close to exhausting the input.
    emit_match:
      do {
        // We have a 4-byte match at ip, and no need to emit any
        // "literal bytes" prior to ip.
        const char* base = ip;
        std::pair<size_t, bool> p =
            FindMatchLength(candidate + 4, ip + 4, ip_end, &data);
        size_t matched = 4 + p.first;
        ip += matched;
        size_t offset = base - candidate;
        assert(0 == memcmp(base, candidate, matched));
        if (p.second) {
          op = EmitCopy</*len_less_than_12=*/true>(op, offset, matched);
        } else {
          op = EmitCopy</*len_less_than_12=*/false>(op, offset, matched);
        }
        if (SNAPPY_PREDICT_FALSE(ip >= ip_limit)) {
          goto emit_remainder;
        }
        // Expect 5 bytes to match
        assert((data & 0xFFFFFFFFFF) ==
               (LittleEndian::Load64(ip) & 0xFFFFFFFFFF));
        // We are now looking for a 4-byte match again.  We read
        // table[Hash(ip, mask)] for that.  To improve compression,
        // we also update table[Hash(ip - 1, mask)] and table[Hash(ip, mask)].
        *TableEntry(table, LittleEndian::Load32(ip - 1), mask) =
            ip - base_ip - 1;
        uint16_t* table_entry = TableEntry(table, data, mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        // Measurements on the benchmarks have shown the following probabilities
        // for the loop to exit (ie. avg. number of iterations is reciprocal).
        // BM_Flat/6  txt1    p = 0.3-0.4
        // BM_Flat/7  txt2    p = 0.35
        // BM_Flat/8  txt3    p = 0.3-0.4
        // BM_Flat/9  txt3    p = 0.34-0.4
        // BM_Flat/10 pb      p = 0.4
        // BM_Flat/11 gaviota p = 0.1
        // BM_Flat/12 cp      p = 0.5
        // BM_Flat/13 c       p = 0.3
      } while (static_cast<uint32_t>(data) == LittleEndian::Load32(candidate));
      // Because the least significant 5 bytes matched, we can utilize data
      // for the next iteration.
      preload = data >> 8;
    }
  }

emit_remainder:
  // Emit the remaining bytes as a literal
  if (ip < ip_end) {
    op = EmitLiteral</*allow_fast_path=*/false>(op, ip, ip_end - ip);
  }

  return op;
}